

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetAllNetworks(Registry *this,NetworkArray *aRet)

{
  PersistentStorage *pPVar1;
  int iVar2;
  Network local_80;
  Status local_19;
  NetworkArray *pNStack_18;
  Status status;
  NetworkArray *aRet_local;
  Registry *this_local;
  
  pPVar1 = this->mStorage;
  pNStack_18 = aRet;
  aRet_local = (NetworkArray *)this;
  Network::Network(&local_80);
  iVar2 = (*pPVar1->_vptr_PersistentStorage[0x16])(pPVar1,&local_80,pNStack_18);
  local_19 = anon_unknown_0::MapStatus((Status)iVar2);
  Network::~Network(&local_80);
  return local_19;
}

Assistant:

Registry::Status Registry::GetAllNetworks(NetworkArray &aRet)
{
    Registry::Status status;

    status = MapStatus(mStorage->Lookup(Network{}, aRet));

    return status;
}